

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

bool __thiscall EquationOr::resolveOperandLeft(EquationOr *this,OperandResolve *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (*this->right->_vptr_PatternEquation[3])();
  if ((char)iVar3 != '\0') {
    iVar3 = state->cur_rightmost;
    iVar1 = state->size;
    iVar2 = iVar3;
    if (iVar1 == -1) {
      iVar2 = -1;
    }
    if (iVar3 == -1) {
      iVar1 = -1;
      iVar2 = iVar3;
    }
    iVar3 = (*this->left->_vptr_PatternEquation[3])(this->left,state);
    if ((char)iVar3 != '\0') {
      if ((state->cur_rightmost != -1) && (state->size != -1)) {
        return true;
      }
      state->cur_rightmost = iVar2;
      state->size = iVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool EquationOr::resolveOperandLeft(OperandResolve &state) const

{
  int4 cur_rightmost = -1;	// Initially we don't know our rightmost
  int4 cur_size = -1;		//   or size traversed since rightmost
  bool res = right->resolveOperandLeft(state);
  if (!res) return false;
  if ((state.cur_rightmost != -1)&&(state.size != -1)) {
    cur_rightmost = state.cur_rightmost;
    cur_size = state.size;
  }
  res = left->resolveOperandLeft(state);
  if (!res) return false;
  if ((state.cur_rightmost == -1)||(state.size == -1)) {
    state.cur_rightmost = cur_rightmost;
    state.size = cur_size;
  }
  return true;
}